

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintFastq(ConvertToolPrivate *this,BamAlignment *a)

{
  bool bVar1;
  ostream *poVar2;
  BamAlignment *in_RSI;
  long in_RDI;
  string sequence;
  string qualities;
  string name;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff30;
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  BamAlignment *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30,(string *)in_RSI);
  bVar1 = BamAlignment::IsPaired(local_10);
  if (bVar1) {
    BamAlignment::IsFirstMate(local_10);
    std::__cxx11::string::append((char *)local_30);
  }
  std::__cxx11::string::string(local_60,(string *)&local_10->Qualities);
  std::__cxx11::string::string(local_80,(string *)&local_10->QueryBases);
  bVar1 = BamAlignment::IsReverseStrand(local_10);
  if (bVar1) {
    Utilities::Reverse(in_stack_ffffffffffffff20);
    Utilities::ReverseComplement(in_stack_ffffffffffffff30);
  }
  poVar2 = std::operator<<((ostream *)(in_RDI + 0x20),'@');
  poVar2 = std::operator<<(poVar2,local_30);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,local_80);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,'+');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,local_60);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintFastq(const BamAlignment& a)
{

    // @BamAlignment.Name
    // BamAlignment.QueryBases
    // +
    // BamAlignment.Qualities
    //
    // N.B. - QueryBases are reverse-complemented (& Qualities reversed) if aligned to reverse strand .
    //        Name is appended "/1" or "/2" if paired-end, to reflect which mate this entry is.

    // handle paired-end alignments
    std::string name = a.Name;
    if (a.IsPaired()) name.append((a.IsFirstMate() ? "/1" : "/2"));

    // handle reverse strand alignment - bases & qualities
    std::string qualities = a.Qualities;
    std::string sequence = a.QueryBases;
    if (a.IsReverseStrand()) {
        Utilities::Reverse(qualities);
        Utilities::ReverseComplement(sequence);
    }

    // write to output stream
    m_out << '@' << name << std::endl
          << sequence << std::endl
          << '+' << std::endl
          << qualities << std::endl;
}